

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v5::internal::grisu2_prettify<fmt::v5::internal::char_counter&>
               (gen_digits_params *params,int size,int exp,char_counter *handler)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (params->fixed == false) {
    iVar4 = params->num_digits - size;
    if (iVar4 == 0 || params->num_digits < size) {
      iVar4 = 0;
    }
    uVar3 = (exp + size) - 1;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    lVar1 = (((long)iVar4 + handler->size) - (ulong)(uVar2 < 100)) + 6;
  }
  else {
    iVar4 = exp + size;
    if (iVar4 < 0x16 && -1 < exp) {
      lVar1 = (ulong)(uint)exp + handler->size;
      handler->size = lVar1;
      uVar2 = params->num_digits - iVar4;
      if (uVar2 == 0 || params->num_digits < iVar4) {
        return;
      }
      if (params->trailing_zeros != true) {
        return;
      }
      lVar1 = lVar1 + (ulong)uVar2 + 1;
    }
    else if (iVar4 < 1) {
      lVar1 = (ulong)(2 - iVar4) + handler->size;
    }
    else {
      lVar1 = handler->size + 1;
      handler->size = lVar1;
      if (params->trailing_zeros != true) {
        return;
      }
      iVar4 = params->num_digits - size;
      if (iVar4 == 0 || params->num_digits < size) {
        return;
      }
      lVar1 = lVar1 + iVar4;
    }
  }
  handler->size = lVar1;
  return;
}

Assistant:

FMT_FUNC void grisu2_prettify(const gen_digits_params &params,
                              int size, int exp, Handler &&handler) {
  if (!params.fixed) {
    // Insert a decimal point after the first digit and add an exponent.
    handler.insert(1, '.');
    exp += size - 1;
    if (size < params.num_digits)
      handler.append(params.num_digits - size, '0');
    handler.append(params.upper ? 'E' : 'e');
    write_exponent(exp, handler);
    return;
  }
  // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
  int full_exp = size + exp;
  const int exp_threshold = 21;
  if (size <= full_exp && full_exp <= exp_threshold) {
    // 1234e7 -> 12340000000[.0+]
    handler.append(full_exp - size, '0');
    int num_zeros = params.num_digits - full_exp;
    if (num_zeros > 0 && params.trailing_zeros) {
      handler.append('.');
      handler.append(num_zeros, '0');
    }
  } else if (full_exp > 0) {
    // 1234e-2 -> 12.34[0+]
    handler.insert(full_exp, '.');
    if (!params.trailing_zeros) {
      // Remove trailing zeros.
      handler.remove_trailing('0');
    } else if (params.num_digits > size) {
      // Add trailing zeros.
      ptrdiff_t num_zeros = params.num_digits - size;
      handler.append(num_zeros, '0');
    }
  } else {
    // 1234e-6 -> 0.001234
    handler.insert(0, 2 - full_exp, fill{to_unsigned(-full_exp)});
  }
}